

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

duckdb_state
duckdb_prepare_extracted_statement
          (duckdb_connection connection,duckdb_extracted_statements extracted_statements,idx_t index
          ,duckdb_prepared_statement *out_prepared_statement)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  element_type *peVar2;
  bool bVar3;
  duckdb_state dVar4;
  duckdb_prepared_statement p_Var5;
  reference pvVar6;
  pointer this;
  element_type *local_38;
  
  dVar4 = DuckDBError;
  if ((out_prepared_statement != (duckdb_prepared_statement *)0x0 &&
       connection != (duckdb_connection)0x0) &&
     (index < (ulong)(*(long *)(extracted_statements + 8) - *(long *)extracted_statements >> 3))) {
    p_Var5 = (duckdb_prepared_statement)operator_new(0x40);
    *(undefined8 *)p_Var5 = 0;
    *(undefined8 *)(p_Var5 + 8) = 0;
    *(undefined8 *)(p_Var5 + 0x20) = 0;
    *(undefined8 *)(p_Var5 + 0x28) = 0;
    *(undefined8 *)(p_Var5 + 0x30) = 0;
    *(undefined8 *)(p_Var5 + 0x38) = 0;
    *(undefined8 *)(p_Var5 + 0x10) = 0;
    *(undefined8 *)(p_Var5 + 0x18) = 0;
    *(duckdb_prepared_statement *)p_Var5 = p_Var5 + 0x30;
    *(undefined8 *)(p_Var5 + 8) = 1;
    *(undefined4 *)(p_Var5 + 0x20) = 0x3f800000;
    *(undefined8 *)(p_Var5 + 0x28) = 0;
    *(undefined8 *)(p_Var5 + 0x30) = 0;
    *(undefined8 *)(p_Var5 + 0x38) = 0;
    pvVar6 = duckdb::
             vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                           *)extracted_statements,index);
    _Var1._M_head_impl =
         (pvVar6->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
         super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
    (pvVar6->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
    _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
    duckdb::Connection::Prepare
              ((Connection *)&local_38,
               (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
               connection);
    peVar2 = local_38;
    local_38 = (element_type *)0x0;
    std::__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
    ::reset((__uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
             *)(p_Var5 + 0x38),(pointer)peVar2);
    peVar2 = local_38;
    if (local_38 != (element_type *)0x0) {
      duckdb::PreparedStatement::~PreparedStatement((PreparedStatement *)local_38);
      operator_delete(peVar2);
    }
    local_38 = (element_type *)0x0;
    if (_Var1._M_head_impl != (SQLStatement *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_SQLStatement + 8))();
    }
    *out_prepared_statement = p_Var5;
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)(p_Var5 + 0x38));
    bVar3 = duckdb::PreparedStatement::HasError(this);
    dVar4 = (duckdb_state)bVar3;
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_prepare_extracted_statement(duckdb_connection connection,
                                                duckdb_extracted_statements extracted_statements, idx_t index,
                                                duckdb_prepared_statement *out_prepared_statement) {
	Connection *conn = reinterpret_cast<Connection *>(connection);
	auto source_wrapper = (ExtractStatementsWrapper *)extracted_statements;

	if (!connection || !out_prepared_statement || index >= source_wrapper->statements.size()) {
		return DuckDBError;
	}
	auto wrapper = new PreparedStatementWrapper();
	wrapper->statement = conn->Prepare(std::move(source_wrapper->statements[index]));

	*out_prepared_statement = (duckdb_prepared_statement)wrapper;
	return wrapper->statement->HasError() ? DuckDBError : DuckDBSuccess;
}